

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProjectApplication.cpp
# Opt level: O2

void ProjectApplication::resize(GLFWwindow *window,int framebufferWidth,int framebufferHeight)

{
  void *pvVar1;
  anon_union_16_4_ea85571f_for_vec<4,_float,_(glm::qualifier)0>_3 local_60;
  undefined4 local_50;
  undefined4 uStack_4c;
  undefined4 uStack_48;
  undefined4 uStack_44;
  undefined4 local_40;
  undefined4 uStack_3c;
  undefined4 uStack_38;
  undefined4 uStack_34;
  undefined4 local_30;
  undefined4 uStack_2c;
  undefined4 uStack_28;
  undefined4 uStack_24;
  
  pvVar1 = glfwGetWindowUserPointer(window);
  glm::perspectiveRH_NO<float>
            ((mat<4,_4,_float,_(glm::qualifier)0> *)&local_60.field_0,120.0,
             (float)framebufferWidth / (float)framebufferHeight,0.1,100.0);
  *(undefined4 *)((long)pvVar1 + 0x88) = local_30;
  *(undefined4 *)((long)pvVar1 + 0x8c) = uStack_2c;
  *(undefined4 *)((long)pvVar1 + 0x90) = uStack_28;
  *(undefined4 *)((long)pvVar1 + 0x94) = uStack_24;
  *(undefined4 *)((long)pvVar1 + 0x78) = local_40;
  *(undefined4 *)((long)pvVar1 + 0x7c) = uStack_3c;
  *(undefined4 *)((long)pvVar1 + 0x80) = uStack_38;
  *(undefined4 *)((long)pvVar1 + 0x84) = uStack_34;
  *(undefined4 *)((long)pvVar1 + 0x68) = local_50;
  *(undefined4 *)((long)pvVar1 + 0x6c) = uStack_4c;
  *(undefined4 *)((long)pvVar1 + 0x70) = uStack_48;
  *(undefined4 *)((long)pvVar1 + 0x74) = uStack_44;
  *(float *)((long)pvVar1 + 0x58) = local_60.field_0.x;
  *(float *)((long)pvVar1 + 0x5c) = local_60.field_0.y;
  *(float *)((long)pvVar1 + 0x60) = local_60.field_0.z;
  *(float *)((long)pvVar1 + 100) = local_60.field_0.w;
  glViewport(0,0,framebufferWidth,framebufferHeight);
  return;
}

Assistant:

void ProjectApplication::resize(GLFWwindow * window, int framebufferWidth, int framebufferHeight)
{
  ProjectApplication & app = *static_cast<ProjectApplication *>(glfwGetWindowUserPointer(window));
  float aspect = framebufferWidth / float(framebufferHeight);
  app.m_proj = glm::perspective(120.f, aspect, 0.1f, 100.f);
  glViewport(0, 0, framebufferWidth, framebufferHeight);
}